

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_stream.c
# Opt level: O0

int update_initial_window_size
              (int32_t *window_size_ptr,int32_t new_initial_window_size,
              int32_t old_initial_window_size)

{
  long lVar1;
  int64_t new_window_size;
  int32_t old_initial_window_size_local;
  int32_t new_initial_window_size_local;
  int32_t *window_size_ptr_local;
  
  lVar1 = ((long)*window_size_ptr + (long)new_initial_window_size) - (long)old_initial_window_size;
  if ((lVar1 < -0x80000000) || (0x7fffffff < lVar1)) {
    window_size_ptr_local._4_4_ = -1;
  }
  else {
    *window_size_ptr = (int32_t)lVar1;
    window_size_ptr_local._4_4_ = 0;
  }
  return window_size_ptr_local._4_4_;
}

Assistant:

static int update_initial_window_size(int32_t *window_size_ptr,
                                      int32_t new_initial_window_size,
                                      int32_t old_initial_window_size) {
  int64_t new_window_size = (int64_t)(*window_size_ptr) +
                            new_initial_window_size - old_initial_window_size;
  if (INT32_MIN > new_window_size ||
      new_window_size > NGHTTP2_MAX_WINDOW_SIZE) {
    return -1;
  }
  *window_size_ptr = (int32_t)new_window_size;
  return 0;
}